

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

int CVmObjString::call_stat_prop(vm_val_t *result,uchar **pc_ptr,uint *argc,vm_prop_id_t prop)

{
  int iVar1;
  vm_prop_id_t in_CX;
  uint *in_RDX;
  uchar **in_RSI;
  vm_val_t *in_RDI;
  int idx;
  uint *in_stack_000000f0;
  vm_val_t *in_stack_000000f8;
  CVmMetaTable *pCVar2;
  undefined4 in_stack_ffffffffffffffd8;
  undefined2 in_stack_ffffffffffffffdc;
  undefined4 local_4;
  
  pCVar2 = G_meta_table_X;
  CVmMetaclass::get_reg_idx(metaclass_reg_);
  iVar1 = CVmMetaTable::prop_to_vector_idx
                    ((CVmMetaTable *)
                     CONCAT26(in_CX,CONCAT24(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)),
                     (uint)((ulong)pCVar2 >> 0x20),(vm_prop_id_t)((ulong)pCVar2 >> 0x10));
  if (iVar1 == 0x14) {
    local_4 = static_getp_packBytes(in_stack_000000f8,in_stack_000000f0);
  }
  else {
    local_4 = CVmObject::call_stat_prop(in_RDI,in_RSI,in_RDX,in_CX);
  }
  return local_4;
}

Assistant:

int CVmObjString::call_stat_prop(VMG_ vm_val_t *result,
                                 const uchar **pc_ptr, uint *argc,
                                 vm_prop_id_t prop)
{
    /* get the function table index */
    int idx = G_meta_table->prop_to_vector_idx(
        metaclass_reg_->get_reg_idx(), prop);

    /* check for static methods */
    switch (idx)
    {
    case PROPIDX_packBytes:
        return static_getp_packBytes(vmg_ result, argc);

    default:
        /* inherit the default handling */
        return CVmObject::call_stat_prop(vmg_ result, pc_ptr, argc, prop);
    }
}